

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

void png_read_rows(png_structrp png_ptr,png_bytepp row,png_bytepp display_row,png_uint_32 num_rows)

{
  png_bytep dptr_1;
  png_bytep rptr_1;
  png_bytep dptr;
  png_bytep rptr;
  png_bytepp dp;
  png_bytepp rp;
  png_uint_32 i;
  png_uint_32 num_rows_local;
  png_bytepp display_row_local;
  png_bytepp row_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((row == (png_bytepp)0x0) || (display_row == (png_bytepp)0x0)) {
      if (row == (png_bytepp)0x0) {
        if (display_row != (png_bytepp)0x0) {
          rptr = (png_bytep)display_row;
          for (rp._0_4_ = 0; (uint)rp < num_rows; rp._0_4_ = (uint)rp + 1) {
            png_read_row(png_ptr,(png_bytep)0x0,*(png_bytep *)rptr);
            rptr = rptr + 8;
          }
        }
      }
      else {
        dp = row;
        for (rp._0_4_ = 0; (uint)rp < num_rows; rp._0_4_ = (uint)rp + 1) {
          png_read_row(png_ptr,*dp,(png_bytep)0x0);
          dp = dp + 1;
        }
      }
    }
    else {
      rptr = (png_bytep)display_row;
      dp = row;
      for (rp._0_4_ = 0; (uint)rp < num_rows; rp._0_4_ = (uint)rp + 1) {
        png_read_row(png_ptr,*dp,*(png_bytep *)rptr);
        rptr = rptr + 8;
        dp = dp + 1;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_read_rows(png_structrp png_ptr, png_bytepp row,
    png_bytepp display_row, png_uint_32 num_rows)
{
   png_uint_32 i;
   png_bytepp rp;
   png_bytepp dp;

   png_debug(1, "in png_read_rows");

   if (png_ptr == NULL)
      return;

   rp = row;
   dp = display_row;
   if (rp != NULL && dp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep rptr = *rp++;
         png_bytep dptr = *dp++;

         png_read_row(png_ptr, rptr, dptr);
      }

   else if (rp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep rptr = *rp;
         png_read_row(png_ptr, rptr, NULL);
         rp++;
      }

   else if (dp != NULL)
      for (i = 0; i < num_rows; i++)
      {
         png_bytep dptr = *dp;
         png_read_row(png_ptr, NULL, dptr);
         dp++;
      }
}